

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

void __thiscall VarnodeBank::replace(VarnodeBank *this,Varnode *oldvn,Varnode *newvn)

{
  bool bVar1;
  reference ppPVar2;
  const_iterator local_60;
  _List_node_base *local_58;
  _Self local_50;
  _List_node_base *local_48;
  int4 local_3c;
  PcodeOp *pPStack_38;
  int4 i;
  PcodeOp *op;
  iterator tmpiter;
  iterator iter;
  Varnode *newvn_local;
  Varnode *oldvn_local;
  VarnodeBank *this_local;
  
  std::_List_iterator<PcodeOp_*>::_List_iterator(&tmpiter);
  std::_List_iterator<PcodeOp_*>::_List_iterator((_List_iterator<PcodeOp_*> *)&op);
  local_48 = (_List_node_base *)
             std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&oldvn->descend);
  tmpiter = (iterator)local_48;
  while( true ) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&oldvn->descend);
    bVar1 = std::operator!=(&tmpiter,&local_50);
    if (!bVar1) break;
    ppPVar2 = std::_List_iterator<PcodeOp_*>::operator*(&tmpiter);
    pPStack_38 = *ppPVar2;
    local_58 = (_List_node_base *)std::_List_iterator<PcodeOp_*>::operator++(&tmpiter,0);
    op = (PcodeOp *)local_58;
    if (pPStack_38->output != newvn) {
      local_3c = PcodeOp::getSlot(pPStack_38,oldvn);
      std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_60,(iterator *)&op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::erase(&oldvn->descend,local_60);
      PcodeOp::clearInput(pPStack_38,local_3c);
      Varnode::addDescend(newvn,pPStack_38);
      PcodeOp::setInput(pPStack_38,newvn,local_3c);
    }
  }
  Varnode::setFlags(oldvn,0x2000000);
  Varnode::setFlags(newvn,0x2000000);
  return;
}

Assistant:

void VarnodeBank::replace(Varnode *oldvn,Varnode *newvn)

{
  list<PcodeOp *>::iterator iter,tmpiter;
  PcodeOp *op;
  int4 i;

  iter = oldvn->descend.begin();
  while(iter!=oldvn->descend.end()) {
    op = *iter;
    tmpiter = iter++;
    if (op->output == newvn) continue; // Cannot be input to your own definition
    i = op->getSlot(oldvn);
    oldvn->descend.erase(tmpiter);	// Sever the link fully
    op->clearInput(i); // Before attempting to build the new link
    newvn->addDescend(op);
    op->setInput(newvn,i); // This must be called AFTER descend is updated
  }
  oldvn->setFlags(Varnode::coverdirty);
  newvn->setFlags(Varnode::coverdirty);
}